

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall
QItemDelegate::drawBackground
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ColorRole CVar3;
  QAbstractItemModel *pQVar4;
  char cVar5;
  bool bVar6;
  ColorRole CVar7;
  QMetaType QVar8;
  ColorRole CVar9;
  QBrush *pQVar10;
  PrivateShared *pPVar11;
  long in_FS_OFFSET;
  QMetaType local_68;
  double dStack_60;
  QMetaType local_50;
  undefined1 local_48 [24];
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((option->showDecorationSelected == true) &&
     (CVar3 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i, (short)CVar3 < 0)) {
    CVar7 = Light;
    if ((CVar3 >> 0x10 & 1) != 0) {
      CVar7 = CVar3 & Button ^ Button;
    }
    CVar9 = Button;
    if ((CVar3 & Button) != WindowText) {
      CVar9 = CVar7;
    }
    QPalette::brush((int)option + 0x28,CVar9);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      return;
    }
  }
  else {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (index->m).ptr;
    if (pQVar4 == (QAbstractItemModel *)0x0) {
      local_48._0_16_ = (undefined1  [16])0x0;
      local_48._16_8_ = (undefined1 *)0x0;
      puStack_30 = (undefined1 *)0x2;
    }
    else {
      (**(code **)(*(long *)pQVar4 + 0x90))(local_48,pQVar4,index,8);
    }
    cVar5 = QMetaType::canConvert
                      ((QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc),
                       (QMetaType)0x7f9f28);
    if (cVar5 != '\0') {
      QPainter::brushOrigin();
      uVar1 = (option->super_QStyleOption).rect.x1;
      uVar2 = (option->super_QStyleOption).rect.y1;
      local_68.d_ptr = (QMetaTypeInterface *)(double)(int)uVar1;
      dStack_60 = (double)(int)uVar2;
      QPainter::setBrushOrigin((QPointF *)painter);
      local_68.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
      local_50.d_ptr = (QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc);
      bVar6 = comparesEqual(&local_50,&local_68);
      if (bVar6) {
        if (((ulong)puStack_30 & 1) == 0) {
          pQVar10 = (QBrush *)local_48;
        }
        else {
          pQVar10 = (QBrush *)(local_48._0_8_ + (long)*(int *)(local_48._0_8_ + 4));
        }
        QBrush::QBrush((QBrush *)&local_50,pQVar10);
      }
      else {
        local_50.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        QBrush::QBrush((QBrush *)&local_50);
        pPVar11 = (PrivateShared *)local_48;
        QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_30 & 1) != 0) {
          pPVar11 = (PrivateShared *)(local_48._0_8_ + (long)*(int *)(local_48._0_8_ + 4));
        }
        QMetaType::convert(QVar8,pPVar11,local_68,&local_50);
      }
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      QBrush::~QBrush((QBrush *)&local_50);
      QPainter::setBrushOrigin((QPointF *)painter);
    }
    ::QVariant::~QVariant((QVariant *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawBackground(QPainter *painter,
                                   const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    if (option.showDecorationSelected && (option.state & QStyle::State_Selected)) {
        QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                                  ? QPalette::Normal : QPalette::Disabled;
        if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
            cg = QPalette::Inactive;

        painter->fillRect(option.rect, option.palette.brush(cg, QPalette::Highlight));
    } else {
        QVariant value = index.data(Qt::BackgroundRole);
        if (value.canConvert<QBrush>()) {
            QPointF oldBO = painter->brushOrigin();
            painter->setBrushOrigin(option.rect.topLeft());
            painter->fillRect(option.rect, qvariant_cast<QBrush>(value));
            painter->setBrushOrigin(oldBO);
        }
    }
}